

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny-format.hh
# Opt level: O1

string * tinyusdz::fmt::format<unsigned_long>
                   (string *__return_storage_ptr__,string *in,unsigned_long *args)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ostringstream ss;
  anon_union_32_2_293c120a_for_storage_t_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  local_1e0;
  char local_1c0;
  long *local_1b8 [2];
  long local_1a8 [2];
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  ios_base local_128 [264];
  
  detail::tokenize((expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e0.m_value,in);
  if (local_1c0 == '\0') {
    pcVar1 = (in->_M_dataplus)._M_p;
    local_1b8[0] = local_1a8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b8,pcVar1,pcVar1 + in->_M_string_length);
    ::std::__cxx11::string::append((char *)local_1b8);
    if (local_1c0 == '\x01') {
      __assert_fail("! has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/expected.hpp"
                    ,0x881,
                    "error_type &nonstd::expected_lite::expected<std::vector<std::basic_string<char>>, std::basic_string<char>>::error() & [T = std::vector<std::basic_string<char>>, E = std::basic_string<char>]"
                   );
    }
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)local_1b8,
                                (ulong)local_1e0.m_value.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_188 = *plVar4;
      lStack_180 = plVar3[3];
      local_198 = &local_188;
    }
    else {
      local_188 = *plVar4;
      local_198 = (long *)*plVar3;
    }
    local_190 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::append((char *)&local_198);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      lVar2 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_198 != &local_188) {
      operator_delete(local_198,local_188 + 1);
    }
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0],local_1a8[0] + 1);
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    if (local_1c0 == '\0') {
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/expected.hpp"
                    ,0x83f,
                    "value_type &nonstd::expected_lite::expected<std::vector<std::basic_string<char>>, std::basic_string<char>>::operator*() & [T = std::vector<std::basic_string<char>>, E = std::basic_string<char>]"
                   );
    }
    detail::format_sv_rec<unsigned_long>((ostringstream *)&local_198,&local_1e0.m_value,0,args);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    ::std::ios_base::~ios_base(local_128);
  }
  nonstd::expected_lite::
  expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~expected((expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_1e0.m_value);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const std::string &in, Args const &...args) {
  auto ret = detail::tokenize(in);
  if (!ret) {
    return in + "(format error: " + ret.error() + ")";
  }

  std::ostringstream ss;
  detail::format_sv(ss, (*ret), args...);

  return ss.str();
}